

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall
wasm::Wasm2JSBuilder::addFunctionImport(Wasm2JSBuilder *this,Ref ast,Function *import)

{
  bool bVar1;
  Ref r;
  Ref RVar2;
  Ref in_R8;
  IString IVar3;
  IString name;
  
  IVar3.str._M_str = (char *)import;
  IVar3.str._M_len = (size_t)(import->super_Importable).base.super_IString.str._M_str;
  bVar1 = ABI::wasm2js::isHelper
                    ((wasm2js *)(import->super_Importable).base.super_IString.str._M_len,IVar3);
  if (bVar1) {
    return;
  }
  ensureModuleVar(this,ast,&import->super_Importable);
  r = cashew::ValueBuilder::makeVar(false);
  cashew::Value::push_back(ast.inst,r);
  IVar3 = fromName(this,(import->super_Importable).super_Named.name.super_IString.str,Top);
  name.str._M_len = IVar3.str._M_str;
  RVar2 = getImportName(this,&import->super_Importable);
  name.str._M_str = (char *)RVar2.inst;
  cashew::ValueBuilder::appendToVar((ValueBuilder *)r.inst,(Value *)IVar3.str._M_len,name,in_R8);
  return;
}

Assistant:

void Wasm2JSBuilder::addFunctionImport(Ref ast, Function* import) {
  // The scratch memory helpers are emitted in the glue, see code and comments
  // below.
  if (ABI::wasm2js::isHelper(import->base)) {
    return;
  }
  ensureModuleVar(ast, *import);
  Ref theVar = ValueBuilder::makeVar();
  ast->push_back(theVar);
  ValueBuilder::appendToVar(
    theVar, fromName(import->name, NameScope::Top), getImportName(*import));
}